

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-parser.cpp
# Opt level: O0

void __thiscall
yactfr::internal::TsdlParser::_addDtAlias(TsdlParser *this,string *name,PseudoDt *pseudoDt)

{
  TextLocation local_38;
  PseudoDt *local_20;
  PseudoDt *pseudoDt_local;
  string *name_local;
  TsdlParser *this_local;
  
  local_20 = pseudoDt;
  pseudoDt_local = (PseudoDt *)name;
  name_local = (string *)this;
  StrScanner::loc(&local_38,&this->_ss);
  _addDtAlias(this,name,pseudoDt,&local_38);
  return;
}

Assistant:

void TsdlParser::_addDtAlias(std::string&& name, const PseudoDt& pseudoDt)
{
    this->_addDtAlias(std::move(name), pseudoDt, _ss.loc());
}